

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O0

bool __thiscall
CETestSuite::test_double
          (CETestSuite *this,double *value,double *expected,string *function,int *line)

{
  bool bVar1;
  double *in_RDX;
  double *in_RSI;
  CETestSuite *in_RDI;
  double relative_tol;
  bool ret_val;
  int *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *in_stack_fffffffffffffce8;
  string local_308 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string local_2a8 [32];
  string local_288 [32];
  string local_268 [32];
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  double local_38;
  bool local_29 [41];
  
  local_29[0] = true;
  local_38 = ABS(*in_RDX * in_RDI->tol_dbl_);
  bVar1 = local_38 < ABS(*in_RSI - *in_RDX);
  if (bVar1) {
    pbVar2 = &local_2c8;
    std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
    std::operator+((char *)in_stack_fffffffffffffce8,pbVar2);
    std::operator+(in_stack_fffffffffffffce8,(char *)pbVar2);
    std::operator+(in_stack_fffffffffffffce8,(char *)pbVar2);
    std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffce8,(char *)pbVar2);
    std::operator+(in_stack_fffffffffffffce8,(char *)pbVar2);
    std::__cxx11::to_string((double)in_stack_fffffffffffffce8);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffce8,(char *)pbVar2);
    log_failure(in_RDI,in_stack_fffffffffffffce8,pbVar2,in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_208);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd18);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::string::~string(local_288);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
  }
  else {
    pbVar2 = &local_158;
    std::__cxx11::to_string((double)pbVar2);
    std::operator+((char *)pbVar2,in_stack_fffffffffffffce0);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffce0);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffce0);
    std::__cxx11::to_string((double)pbVar2);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffce0);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffce0);
    std::__cxx11::to_string((double)pbVar2);
    std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(pbVar2,(char *)in_stack_fffffffffffffce0);
    log_success(in_RDI,pbVar2,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_1a8);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_188);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string((string *)&local_158);
  }
  local_29[0] = !bVar1;
  (*in_RDI->_vptr_CETestSuite[0xf])(in_RDI,local_29);
  return (bool)(local_29[0] & 1);
}

Assistant:

bool CETestSuite::test_double(const double&      value, 
                              const double&      expected,
                              const std::string& function,
                              const int&         line)
{
    // Return status
    bool   ret_val      = true;
    double relative_tol = std::fabs(expected * tol_dbl_);

    // Values equal within tolerance
    if (std::fabs(value - expected) <= relative_tol) {
        log_success("DOUBLE value of "+std::to_string(value)+" is within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = true;
    } 
    // Values not within tolerance
    else {
        log_failure("DOUBLE value of "+std::to_string(value)+" is NOT within " +
                    "tolerance of "+std::to_string(relative_tol)+" of " +
                    "expected value "+std::to_string(expected)+".",
                    function, line);
        ret_val = false;
    }

    update_pass(ret_val);
    return ret_val;
}